

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructBody
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t index,bool in_array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  FieldDef *field;
  StructDef *pSVar3;
  pointer pcVar4;
  EnumDef *pEVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar6;
  char *pcVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *plVar10;
  size_type *psVar11;
  pointer ppFVar12;
  ulong uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  undefined7 in_register_00000089;
  ulong uVar16;
  bool bVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_148;
  Type local_128;
  string local_108;
  uint local_e4;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  CSharpGenerator *local_80;
  Value *local_78;
  StructDef *local_70;
  size_t local_68;
  char *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  size_t local_38;
  
  local_e4 = (uint)CONCAT71(in_register_00000089,in_array);
  local_c0 = local_b0;
  local_80 = this;
  local_70 = struct_def;
  local_68 = index;
  local_60 = nameprefix;
  std::__cxx11::string::_M_construct((ulong)&local_c0,(char)index * '\x02' + '\x02');
  local_128._0_8_ = &local_128.enum_def;
  std::__cxx11::string::_M_construct<char*>((string *)&local_128,local_c0,local_b8 + (long)local_c0)
  ;
  std::__cxx11::string::append((char *)&local_128);
  ppaVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)&local_128.enum_def;
  std::__cxx11::string::_M_append((char *)code_ptr,local_128._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_128._0_8_ != ppaVar6) {
    operator_delete((void *)local_128._0_8_,
                    CONCAT62(local_128.enum_def._2_6_,local_128.enum_def._0_2_) + 1);
  }
  NumToString<unsigned_long>(&local_108,local_70->minalign);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
  plVar10 = plVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar10) {
    local_128.enum_def._0_2_ = (undefined2)*plVar10;
    local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
    local_128.fixed_length = (uint16_t)plVar8[3];
    local_128._26_6_ = SUB86((ulong)plVar8[3] >> 0x10,0);
    local_128._0_8_ = ppaVar6;
  }
  else {
    local_128.enum_def._0_2_ = (undefined2)*plVar10;
    local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
    local_128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_128.struct_def._0_2_ = (undefined2)plVar8[1];
  local_128.struct_def._2_6_ = (undefined6)((ulong)plVar8[1] >> 0x10);
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,local_128._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_128._0_8_ != ppaVar6) {
    operator_delete((void *)local_128._0_8_,
                    CONCAT62(local_128.enum_def._2_6_,local_128.enum_def._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_108,local_70->bytesize);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
  plVar10 = plVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar10) {
    local_128.enum_def._0_2_ = (undefined2)*plVar10;
    local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
    local_128.fixed_length = (uint16_t)plVar8[3];
    local_128._26_6_ = SUB86((ulong)plVar8[3] >> 0x10,0);
    local_128._0_8_ = ppaVar6;
  }
  else {
    local_128.enum_def._0_2_ = (undefined2)*plVar10;
    local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
    local_128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_128.struct_def._0_2_ = (undefined2)plVar8[1];
  local_128.struct_def._2_6_ = (undefined6)((ulong)plVar8[1] >> 0x10);
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,local_128._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_128._0_8_ != ppaVar6) {
    operator_delete((void *)local_128._0_8_,
                    CONCAT62(local_128.enum_def._2_6_,local_128.enum_def._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  ppFVar12 = (local_70->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar12 !=
      (local_70->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = local_68 + 1;
    paVar1 = &local_e0.field_2;
    do {
      field = ppFVar12[-1];
      if (field->padding != 0) {
        local_128._0_8_ = &local_128.enum_def;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_128);
        std::__cxx11::string::_M_append((char *)code_ptr,local_128._0_8_);
        if ((EnumDef **)local_128._0_8_ != &local_128.enum_def) {
          operator_delete((void *)local_128._0_8_,
                          CONCAT62(local_128.enum_def._2_6_,local_128.enum_def._0_2_) + 1);
        }
        NumToString<unsigned_long>(&local_108,field->padding);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_128._0_8_ = &local_128.enum_def;
        plVar10 = plVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar10) {
          local_128.enum_def._0_2_ = (undefined2)*plVar10;
          local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
          local_128.fixed_length = (uint16_t)plVar8[3];
          local_128._26_6_ = SUB86((ulong)plVar8[3] >> 0x10,0);
        }
        else {
          local_128.enum_def._0_2_ = (undefined2)*plVar10;
          local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
          local_128._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_128.struct_def._0_2_ = (undefined2)plVar8[1];
        local_128.struct_def._2_6_ = (undefined6)((ulong)plVar8[1] >> 0x10);
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,local_128._0_8_);
        if ((EnumDef **)local_128._0_8_ != &local_128.enum_def) {
          operator_delete((void *)local_128._0_8_,
                          CONCAT62(local_128.enum_def._2_6_,local_128.enum_def._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      local_78 = &field->value;
      BVar2 = (local_78->type).base_type;
      if ((BVar2 == BASE_TYPE_STRUCT) && (((field->value).type.struct_def)->fixed == true)) {
        pSVar3 = (field->value).type.struct_def;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        pcVar4 = (field->super_Definition).name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar4,
                   pcVar4 + (field->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_108);
        pcVar7 = local_60;
        strlen(local_60);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_108,0,(char *)0x0,(ulong)pcVar7);
        local_128._0_8_ = &local_128.enum_def;
        plVar10 = plVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar10) {
          local_128.enum_def._0_2_ = (undefined2)*plVar10;
          local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
          local_128.fixed_length = (uint16_t)plVar8[3];
          local_128._26_6_ = SUB86((ulong)plVar8[3] >> 0x10,0);
        }
        else {
          local_128.enum_def._0_2_ = (undefined2)*plVar10;
          local_128.enum_def._2_6_ = (undefined6)((ulong)*plVar10 >> 0x10);
          local_128._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_128.struct_def._0_2_ = (undefined2)plVar8[1];
        local_128.struct_def._2_6_ = (undefined6)((ulong)plVar8[1] >> 0x10);
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        GenStructBody(local_80,pSVar3,code_ptr,(char *)local_128._0_8_,local_68,
                      (bool)((byte)local_e4 & 1));
        if ((EnumDef **)local_128._0_8_ != &local_128.enum_def) {
          uVar14 = CONCAT62(local_128.enum_def._2_6_,local_128.enum_def._0_2_);
          _Var15._M_p = (pointer)local_128._0_8_;
LAB_001b84f7:
          operator_delete(_Var15._M_p,uVar14 + 1);
        }
      }
      else {
        if (BVar2 == BASE_TYPE_ARRAY) {
          pSVar3 = (field->value).type.struct_def;
          pEVar5 = (field->value).type.enum_def;
          local_128.fixed_length = (field->value).type.fixed_length;
          local_128.element = BASE_TYPE_NONE;
          local_128.base_type = (field->value).type.element;
          local_128.struct_def._0_2_ = SUB82(pSVar3,0);
          local_128.struct_def._2_6_ = (undefined6)((ulong)pSVar3 >> 0x10);
          local_128.enum_def._0_2_ = SUB82(pEVar5,0);
          local_128.enum_def._2_6_ = (undefined6)((ulong)pEVar5 >> 0x10);
        }
        else {
          local_128._0_8_ = *(undefined8 *)&local_78->type;
          pSVar3 = (field->value).type.struct_def;
          uVar14 = *(undefined8 *)((long)&(field->value).type.enum_def + 2);
          local_128.enum_def._0_2_ =
               (undefined2)
               ((ulong)*(undefined8 *)((long)&(field->value).type.struct_def + 2) >> 0x30);
          local_128.enum_def._2_6_ = (undefined6)uVar14;
          local_128.fixed_length = (uint16_t)((ulong)uVar14 >> 0x30);
          local_128.struct_def._0_2_ = SUB82(pSVar3,0);
          local_128.struct_def._2_6_ = (undefined6)((ulong)pSVar3 >> 0x10);
        }
        NumToString<unsigned_long>(&local_148,local_68);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x376a54);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_108.field_2._M_allocated_capacity = *psVar11;
          local_108.field_2._8_8_ = plVar8[3];
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar11;
          local_108._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_108._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((local_78->type).base_type == BASE_TYPE_ARRAY) {
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_c0,local_b8 + (long)local_c0);
          std::__cxx11::string::append((char *)&local_a0);
          paVar9 = &local_148.field_2;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a0,(ulong)local_108._M_dataplus._M_p);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0.field_2._8_8_ = plVar8[3];
            local_e0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_e0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148.field_2._8_8_ = plVar8[3];
            local_148._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_148._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar9) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90 + 1);
          }
          NumToString<unsigned_short>(&local_148,(field->value).type.fixed_length);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar9) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_58,"; ",&local_108);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_58);
          local_a0 = &local_90;
          plVar10 = plVar8 + 2;
          if ((long *)*plVar8 == plVar10) {
            local_90 = *plVar10;
            lStack_88 = plVar8[3];
          }
          else {
            local_90 = *plVar10;
            local_a0 = (long *)*plVar8;
          }
          local_98 = plVar8[1];
          *plVar8 = (long)plVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a0,(ulong)local_108._M_dataplus._M_p);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0.field_2._8_8_ = plVar8[3];
            local_e0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_e0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148.field_2._8_8_ = plVar8[3];
            local_148._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_148._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar9) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90 + 1);
          }
          paVar9 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar9) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            paVar9 = extraout_RAX;
          }
          local_e4 = (uint)CONCAT71((int7)((ulong)paVar9 >> 8),1);
        }
        if ((local_128.base_type == BASE_TYPE_STRUCT) &&
           (*(char *)(CONCAT62(local_128.struct_def._2_6_,local_128.struct_def._0_2_) + 0x110) ==
            '\x01')) {
          pSVar3 = (field->value).type.struct_def;
          pcVar4 = (field->super_Definition).name._M_dataplus._M_p;
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar4,
                     pcVar4 + (field->super_Definition).name._M_string_length);
          std::__cxx11::string::append((char *)&local_e0);
          pcVar7 = local_60;
          strlen(local_60);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_e0,0,(char *)0x0,(ulong)pcVar7);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148.field_2._8_8_ = plVar8[3];
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_148._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          GenStructBody(local_80,pSVar3,code_ptr,local_148._M_dataplus._M_p,local_38,
                        (bool)((byte)local_e4 & 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          uVar14 = local_e0.field_2._M_allocated_capacity;
          _Var15._M_p = local_e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
LAB_001b8488:
            operator_delete(_Var15._M_p,uVar14 + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)code_ptr);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_c0,local_b8 + (long)local_c0);
          std::__cxx11::string::append((char *)&local_148);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          GenMethod_abi_cxx11_(&local_e0,local_80,&local_128);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148.field_2._8_8_ = plVar8[3];
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_148._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          SourceCast_abi_cxx11_(&local_148,local_80,&local_128,false);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          Name_abi_cxx11_(&local_e0,local_80,field);
          pcVar7 = local_60;
          strlen(local_60);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_e0,0,(char *)0x0,(ulong)pcVar7);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148.field_2._8_8_ = plVar8[3];
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_148._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          uVar16 = ((local_78->type).base_type == BASE_TYPE_ARRAY) + local_68;
          if (uVar16 != 0) {
            std::__cxx11::string::append((char *)code_ptr);
            if ((local_e4 & 1) != 0) {
              uVar13 = 1;
              do {
                NumToString<unsigned_long>(&local_58,uVar13 - 1);
                plVar8 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_58,0,(char *)0x0,0x376a54);
                local_a0 = &local_90;
                plVar10 = plVar8 + 2;
                if ((long *)*plVar8 == plVar10) {
                  local_90 = *plVar10;
                  lStack_88 = plVar8[3];
                }
                else {
                  local_90 = *plVar10;
                  local_a0 = (long *)*plVar8;
                }
                local_98 = plVar8[1];
                *plVar8 = (long)plVar10;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
                psVar11 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_e0.field_2._M_allocated_capacity = *psVar11;
                  local_e0.field_2._8_8_ = plVar8[3];
                  local_e0._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_e0.field_2._M_allocated_capacity = *psVar11;
                  local_e0._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_e0._M_string_length = plVar8[1];
                *plVar8 = (long)psVar11;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != paVar1) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                if (local_a0 != &local_90) {
                  operator_delete(local_a0,local_90 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                if (uVar16 != uVar13) {
                  std::__cxx11::string::append((char *)code_ptr);
                }
              } while (((local_e4 & 1) != 0) &&
                      (bVar17 = uVar13 < uVar16, uVar13 = uVar13 + 1, bVar17));
            }
            std::__cxx11::string::append((char *)code_ptr);
          }
          std::__cxx11::string::append((char *)code_ptr);
          uVar14 = local_148.field_2._M_allocated_capacity;
          _Var15._M_p = local_148._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_001b8488;
        }
        if ((local_78->type).base_type == BASE_TYPE_ARRAY) {
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_c0,local_b8 + (long)local_c0);
          std::__cxx11::string::append((char *)&local_148);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148._M_dataplus._M_p);
          uVar14 = local_148.field_2._M_allocated_capacity;
          _Var15._M_p = local_148._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_001b84f7;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      ppFVar12 = ppFVar12 + -1;
    } while (ppFVar12 !=
             (local_70->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t index = 0,
                     bool in_array = false) const {
    std::string &code = *code_ptr;
    std::string indent((index + 1) * 2, ' ');
    code += indent + "  builder.Prep(";
    code += NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ");\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field.padding) {
        code += indent + "  builder.Pad(";
        code += NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field_type)) {
        GenStructBody(*field_type.struct_def, code_ptr,
                      (nameprefix + (field.name + "_")).c_str(), index,
                      in_array);
      } else {
        const auto &type =
            IsArray(field_type) ? field_type.VectorType() : field_type;
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "  for (int " + index_var + " = ";
          code += NumToString(field_type.fixed_length);
          code += "; " + index_var + " > 0; " + index_var + "--) {\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          GenStructBody(*field_type.struct_def, code_ptr,
                        (nameprefix + (field.name + "_")).c_str(), index + 1,
                        in_array);
        } else {
          code += IsArray(field_type) ? "  " : "";
          code += indent + "  builder.Put";
          code += GenMethod(type) + "(";
          code += SourceCast(type);
          auto argname = nameprefix + Name(field);
          code += argname;
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          if (array_cnt > 0) {
            code += "[";
            for (size_t i = 0; in_array && i < array_cnt; i++) {
              code += "_idx" + NumToString(i) + "-1";
              if (i != (array_cnt - 1)) code += ",";
            }
            code += "]";
          }
          code += ");\n";
        }
        if (IsArray(field_type)) { code += indent + "  }\n"; }
      }
    }
  }